

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_ddos_flow_graph.cc
# Opt level: O2

int __thiscall
aliyun::Yundun::DdosFlowGraph
          (Yundun *this,YundunDdosFlowGraphRequestType *req,
          YundunDdosFlowGraphResponseType *response,YundunErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  Int IVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  int i;
  uint uVar8;
  char *pcVar9;
  int i_1;
  allocator<char> local_364;
  allocator<char> local_363;
  allocator<char> local_362;
  allocator<char> local_361;
  Value val;
  undefined1 local_348 [32];
  long local_328;
  string str_response;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar9 = "http";
  if (this->use_tls_ != false) {
    pcVar9 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar9,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_364);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar9 = this->proxy_host_, pcVar9 != (char *)0x0)) &&
     (*pcVar9 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar9,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DdosFlowGraph",&local_364);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"InstanceId",(allocator<char> *)local_348);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->instance_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"InstanceType",(allocator<char> *)local_348);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->instance_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"RegionId",(allocator<char> *)local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,this->region_id_,&local_364);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_348,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_348,anon_var_dwarf_12f544 + 9,&local_364);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_348);
        std::__cxx11::string::~string((string *)local_348);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_348,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_348,anon_var_dwarf_12f544 + 9,&local_361);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_348);
        std::__cxx11::string::~string((string *)local_348);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_348,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_348,anon_var_dwarf_12f544 + 9,&local_362);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_348);
        std::__cxx11::string::~string((string *)local_348);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_348,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_348,anon_var_dwarf_12f544 + 9,&local_363);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_348);
        std::__cxx11::string::~string((string *)local_348);
      }
      if (response != (YundunDdosFlowGraphResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"NormalFlows");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"NormalFlows");
          bVar1 = Json::Value::isMember(pVVar5,"NormalFlow");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"NormalFlows");
            pVVar5 = Json::Value::operator[](pVVar5,"NormalFlow");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (uVar8 = 0; AVar3 = Json::Value::size(pVVar5), uVar8 < AVar3; uVar8 = uVar8 + 1) {
                pVVar6 = Json::Value::operator[](pVVar5,uVar8);
                bVar1 = Json::Value::isMember(pVVar6,"time");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"time");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_348._0_8_ = SEXT48(IVar4);
                }
                bVar1 = Json::Value::isMember(pVVar6,"BitRecv");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"BitRecv");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_348._8_8_ = SEXT48(IVar4);
                }
                bVar1 = Json::Value::isMember(pVVar6,"BitSend");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"BitSend");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_348._16_8_ = SEXT48(IVar4);
                }
                bVar1 = Json::Value::isMember(pVVar6,"PktRecv");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"PktRecv");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_348._24_8_ = SEXT48(IVar4);
                }
                bVar1 = Json::Value::isMember(pVVar6,"PktSend");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"PktSend");
                  IVar4 = Json::Value::asInt(pVVar6);
                  local_328 = (long)IVar4;
                }
                std::
                vector<aliyun::YundunDdosFlowGraphNormalFlowType,_std::allocator<aliyun::YundunDdosFlowGraphNormalFlowType>_>
                ::push_back(&response->normal_flows,(value_type *)local_348);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"TotalFlows");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TotalFlows");
          bVar1 = Json::Value::isMember(pVVar5,"TotalFlow");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"TotalFlows");
            pVVar5 = Json::Value::operator[](pVVar5,"TotalFlow");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (uVar8 = 0; AVar3 = Json::Value::size(pVVar5), uVar8 < AVar3; uVar8 = uVar8 + 1) {
                pVVar6 = Json::Value::operator[](pVVar5,uVar8);
                bVar1 = Json::Value::isMember(pVVar6,"time");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"time");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_348._0_8_ = SEXT48(IVar4);
                }
                bVar1 = Json::Value::isMember(pVVar6,"BitRecv");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"BitRecv");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_348._8_8_ = SEXT48(IVar4);
                }
                bVar1 = Json::Value::isMember(pVVar6,"PktRecv");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"PktRecv");
                  IVar4 = Json::Value::asInt(pVVar6);
                  local_348._16_8_ = SEXT48(IVar4);
                }
                std::
                vector<aliyun::YundunDdosFlowGraphTotalFlowType,_std::allocator<aliyun::YundunDdosFlowGraphTotalFlowType>_>
                ::push_back(&response->total_flows,(value_type *)local_348);
              }
            }
          }
        }
      }
      goto LAB_00133094;
    }
  }
  iVar2 = -1;
  if (error_info != (YundunErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00133094:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Yundun::DdosFlowGraph(const YundunDdosFlowGraphRequestType& req,
                      YundunDdosFlowGraphResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DdosFlowGraph");
  if(!req.instance_id.empty()) {
    req_rpc->AddRequestQuery("InstanceId", req.instance_id);
  }
  if(!req.instance_type.empty()) {
    req_rpc->AddRequestQuery("InstanceType", req.instance_type);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}